

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::shiftUp(Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  Node *pNVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  Node *pNVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Character CVar11;
  float fVar12;
  long lVar13;
  size_t idx;
  
  pNVar6 = this->mKeyVals;
  *(undefined8 *)&pNVar6[startIdx].mData.second.texcoords[1].y =
       *(undefined8 *)&pNVar6[startIdx - 1].mData.second.texcoords[1].y;
  pNVar1 = pNVar6 + (startIdx - 1);
  CVar11 = (pNVar1->mData).first;
  fVar12 = (pNVar1->mData).second.origin.x;
  uVar8 = *(undefined8 *)&(pNVar1->mData).second.origin.y;
  pfVar2 = &pNVar6[startIdx - 1].mData.second.dimensions.y;
  uVar9 = *(undefined8 *)(pfVar2 + 2);
  pfVar3 = &pNVar6[startIdx].mData.second.dimensions.y;
  *(undefined8 *)pfVar3 = *(undefined8 *)pfVar2;
  *(undefined8 *)(pfVar3 + 2) = uVar9;
  pNVar6 = pNVar6 + startIdx;
  (pNVar6->mData).first = CVar11;
  (pNVar6->mData).second.origin.x = fVar12;
  *(undefined8 *)&(pNVar6->mData).second.origin.y = uVar8;
  if (startIdx - 1 != insertion_idx) {
    lVar13 = (insertion_idx - startIdx) + 1;
    lVar7 = startIdx * 0x28;
    do {
      pNVar6 = this->mKeyVals;
      *(undefined8 *)((long)&pNVar6[-1].mData.second.texcoords[1].y + lVar7) =
           *(undefined8 *)((long)&pNVar6[-2].mData.second.texcoords[1].y + lVar7);
      puVar4 = (undefined8 *)((long)pNVar6[-2].mData.second.texcoords + lVar7 + -0x14);
      uVar8 = *puVar4;
      uVar9 = puVar4[1];
      puVar4 = (undefined8 *)((long)pNVar6[-2].mData.second.texcoords + lVar7 + -4);
      uVar10 = puVar4[1];
      puVar5 = (undefined8 *)((long)pNVar6[-1].mData.second.texcoords + lVar7 + -4);
      *puVar5 = *puVar4;
      puVar5[1] = uVar10;
      puVar4 = (undefined8 *)((long)pNVar6[-1].mData.second.texcoords + lVar7 + -0x14);
      *puVar4 = uVar8;
      puVar4[1] = uVar9;
      lVar13 = lVar13 + 1;
      lVar7 = lVar7 + -0x28;
    } while (lVar13 != 0);
  }
  if (startIdx != insertion_idx) {
    do {
      this->mInfo[startIdx] = this->mInfo[startIdx - 1] + (char)this->mInfoInc;
      if (0xff < (uint)this->mInfo[startIdx] + this->mInfoInc) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }